

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O3

GetInfluences * __thiscall wasm::LocalGraph::getGetInfluences(LocalGraph *this,LocalGet *get)

{
  const_iterator cVar1;
  GetInfluences *local_20;
  LocalGet *local_18;
  LocalGet *get_local;
  
  local_18 = get;
  cVar1 = std::
          _Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->getInfluences)._M_h,&local_18);
  if (cVar1.
      super__Node_iterator_base<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    if (getGetInfluences(wasm::LocalGet*)::empty == '\0') {
      getGetInfluences();
    }
    else {
      local_20 = &getGetInfluences::empty;
    }
  }
  else {
    local_20 = (GetInfluences *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false>
                      ._M_cur + 0x10);
  }
  return local_20;
}

Assistant:

const GetInfluences& getGetInfluences(LocalGet* get) const {
    auto iter = getInfluences.find(get);
    if (iter == getInfluences.end()) {
      // Use a canonical constant empty set to avoid allocation.
      static const GetInfluences empty;
      return empty;
    }
    return iter->second;
  }